

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_httpreq_ext *pvVar2;
  char *str;
  char *pcVar3;
  size_t __n;
  size_t sVar4;
  char *pcVar5;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  bool bVar6;
  size_t vallen;
  char *val;
  size_t namelen;
  char *name;
  char *p;
  char *cname;
  TadsHttpRequestHeader *hdrs;
  TadsHttpRequest *req;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  vm_val_t *in_stack_ffffffffffffff68;
  size_t sVar7;
  int local_8c;
  char *len;
  TadsHttpRequestHeader *pTVar8;
  
  if (in_RCX == (int *)0x0) {
    local_8c = 0;
  }
  else {
    local_8c = *in_RCX;
  }
  if ((getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getCookie::desc,1);
    __cxa_guard_release(&getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff68,
                     (uint *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff58);
  if (iVar1 == 0) {
    pvVar2 = get_ext(in_RDI);
    pTVar8 = pvVar2->req->hdr_list;
    CVmStack::get(0);
    str = vm_val_t::get_as_string(in_stack_ffffffffffffff58);
    if (str == (char *)0x0) {
      err_throw(0);
    }
    vm_val_t::set_nil(in_RDX);
    for (pTVar8 = pTVar8->nxt; pTVar8 != (TadsHttpRequestHeader *)0x0; pTVar8 = pTVar8->nxt) {
      iVar1 = stricmp((char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      (char *)in_stack_ffffffffffffff58);
      if (iVar1 == 0) {
        len = pTVar8->value;
        while (pcVar5 = len, *len != '\0') {
          while (iVar1 = isspace((int)*pcVar5), len = pcVar5, iVar1 != 0) {
            pcVar5 = pcVar5 + 1;
          }
          while( true ) {
            bVar6 = false;
            if (*len != '\0') {
              pcVar3 = strchr("=;,",(int)*len);
              bVar6 = pcVar3 == (char *)0x0;
            }
            if (!bVar6) break;
            len = len + 1;
          }
          __n = (long)len - (long)pcVar5;
          if (*len == '=') {
            do {
              len = len + 1;
              bVar6 = false;
              if (*len != '\0') {
                pcVar3 = strchr(" \t;,",(int)*len);
                bVar6 = pcVar3 == (char *)0x0;
              }
            } while (bVar6);
          }
          sVar7 = __n;
          sVar4 = vmb_get_len((char *)0x254f6b);
          if ((sVar7 == sVar4) && (iVar1 = memcmp(pcVar5,str + 2,__n), iVar1 == 0)) {
            new_parsed_str((vm_val_t *)pTVar8,str,(size_t)len,(int)((ulong)pcVar5 >> 0x20));
            goto LAB_0025501e;
          }
          while( true ) {
            bVar6 = false;
            if (*len != '\0') {
              pcVar5 = strchr(" \t;,",(int)*len);
              bVar6 = pcVar5 != (char *)0x0;
            }
            if (!bVar6) break;
            len = len + 1;
          }
          in_stack_ffffffffffffff67 = 0;
        }
      }
    }
LAB_0025501e:
    CVmStack::discard(local_8c);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* get the cookie name argument */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    if (cname == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* presume we won't find a match */
    retval->set_nil();

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* if this matches the name we're looking for, return it */
                if (namelen == vmb_get_len(cname)
                    && memcmp(name, cname + VMB_LEN, namelen) == 0)
                {
                    /* it's a match - return the value as a string */
                    new_parsed_str(vmg_ retval, val, vallen, ENCMODE_NONE);

                    /* stop looking */
                    goto done;
                }
                
                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

done:
    /* done with the arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}